

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O0

void __thiscall OpenMD::GofRTheta::processHistogram(GofRTheta *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  SnapshotManager *this_00;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  reference pvVar7;
  reference this_01;
  reference pvVar8;
  RadialDistrFunc *in_RDI;
  RealType RVar9;
  double dVar10;
  double dVar11;
  uint j;
  RealType nIdeal;
  RealType volSlice;
  RealType rUpper;
  RealType rLower;
  uint i;
  RealType pairConstant;
  RealType pairDensity;
  RealType volume;
  int nPairs;
  Snapshot *in_stack_ffffffffffffff90;
  uint local_54;
  uint local_2c;
  
  iVar3 = RadialDistrFunc::getNPairs(in_RDI);
  this_00 = SimInfo::getSnapshotManager((in_RDI->super_StaticAnalyser).info_);
  SnapshotManager::getCurrentSnapshot(this_00);
  RVar9 = Snapshot::getVolume(in_stack_ffffffffffffff90);
  iVar1 = *(int *)&in_RDI[1].super_StaticAnalyser.info_;
  local_2c = 0;
  while( true ) {
    sVar4 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)&in_RDI[1].evaluator2_);
    if (sVar4 <= local_2c) break;
    dVar10 = (double)local_2c * *(double *)&in_RDI[1].super_StaticAnalyser.dumpFilename_.field_2;
    dVar11 = dVar10 + *(double *)&in_RDI[1].super_StaticAnalyser.dumpFilename_.field_2;
    local_54 = 0;
    while( true ) {
      uVar5 = (ulong)local_54;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&in_RDI[1].evaluator2_,(ulong)local_2c);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
      if (sVar4 <= uVar5) break;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&in_RDI[1].evaluator2_,(ulong)local_2c);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(ulong)local_54);
      iVar2 = *pvVar7;
      this_01 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)((long)&in_RDI[1].evaluator2_.compiler.filename.field_2 + 8),
                             (ulong)local_2c);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(ulong)local_54);
      *pvVar8 = (double)iVar2 /
                ((dVar11 * dVar11 * dVar11 + -(dVar10 * dVar10 * dVar10)) *
                ((((double)iVar3 / RVar9) * 12.566370614359172) / ((double)iVar1 * 3.0))) + *pvVar8;
      local_54 = local_54 + 1;
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void GofRTheta::processHistogram() {
    int nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType pairDensity = nPairs / volume;
    RealType pairConstant =
        (4.0 * Constants::PI * pairDensity) / (3.0 * (double)nAngleBins_);

    for (unsigned int i = 0; i < histogram_.size(); ++i) {
      RealType rLower = i * deltaR_;
      RealType rUpper = rLower + deltaR_;
      RealType volSlice =
          (rUpper * rUpper * rUpper) - (rLower * rLower * rLower);
      RealType nIdeal = volSlice * pairConstant;

      for (unsigned int j = 0; j < histogram_[i].size(); ++j) {
        avgGofr_[i][j] += histogram_[i][j] / nIdeal;
      }
    }
  }